

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O1

DateTime FindCrossingPoint(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *initial_time1,
                          DateTime *initial_time2,bool finding_aos)

{
  DateTime DVar1;
  bool bVar2;
  long lVar3;
  undefined7 in_register_00000081;
  int iVar4;
  DateTime DVar5;
  int64_t iVar6;
  DateTime local_110;
  int local_104;
  long local_100;
  CoordTopocentric topo;
  Observer obs;
  Eci eci;
  
  libsgp4::Observer::Observer(&obs,user_geo);
  DVar5 = (DateTime)initial_time1->m_encoded;
  iVar6 = initial_time2->m_encoded;
  local_110.m_encoded = 0;
  libsgp4::DateTime::Initialise(&local_110,1,1,1,0,0,0,0);
  local_104 = (int)CONCAT71(in_register_00000081,finding_aos);
  local_100 = -1000000;
  if (local_104 != 0) {
    local_100 = 1000000;
  }
  bVar2 = true;
  iVar4 = 0x11;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) break;
    local_110.m_encoded =
         (long)(((double)(iVar6 - DVar5.m_encoded) / 1000000.0) * 0.5 * 1000000.0) + DVar5.m_encoded
    ;
    libsgp4::SGP4::FindPosition(&eci,sgp4,&local_110);
    libsgp4::Observer::GetLookAngle(&topo,&obs,&eci);
    DVar1.m_encoded = local_110.m_encoded;
    if (0.0 < topo.elevation != (bool)(char)local_104) {
      DVar5.m_encoded = local_110.m_encoded;
      DVar1.m_encoded = iVar6;
    }
    iVar6 = DVar1.m_encoded;
    if ((double)(iVar6 - DVar5.m_encoded) / 1000000.0 < 1.0) {
      local_110.m_encoded = local_100 + (local_110.m_encoded / 1000000) * 1000000;
      bVar2 = false;
    }
  } while (bVar2);
  lVar3 = 1000000;
  if ((char)local_104 != '\0') {
    lVar3 = -1000000;
  }
  bVar2 = true;
  iVar4 = 7;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return (DateTime)local_110.m_encoded;
    }
    libsgp4::SGP4::FindPosition(&eci,sgp4,&local_110);
    libsgp4::Observer::GetLookAngle(&topo,&obs,&eci);
    if (topo.elevation <= 0.0) {
      bVar2 = false;
    }
    else {
      local_110.m_encoded = local_110.m_encoded + lVar3;
    }
  } while (bVar2);
  return (DateTime)local_110.m_encoded;
}

Assistant:

libsgp4::DateTime FindCrossingPoint(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& initial_time1,
        const libsgp4::DateTime& initial_time2,
        bool finding_aos)
{
    libsgp4::Observer obs(user_geo);

    bool running;
    int cnt;

    libsgp4::DateTime time1(initial_time1);
    libsgp4::DateTime time2(initial_time2);
    libsgp4::DateTime middle_time;

    running = true;
    cnt = 0;
    while (running && cnt++ < 16)
    {
        middle_time = time1.AddSeconds((time2 - time1).TotalSeconds() / 2.0);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

        if (topo.elevation > 0.0)
        {
            /*
             * satellite above horizon
             */
            if (finding_aos)
            {
                time2 = middle_time;
            }
            else
            {
                time1 = middle_time;
            }
        }
        else
        {
            if (finding_aos)
            {
                time1 = middle_time;
            }
            else
            {
                time2 = middle_time;
            }
        }

        if ((time2 - time1).TotalSeconds() < 1.0)
        {
            /*
             * two times are within a second, stop
             */
            running = false;
            /*
             * remove microseconds
             */
            int us = middle_time.Microsecond();
            middle_time = middle_time.AddMicroseconds(-us);
            /*
             * step back into the pass by 1 second
             */
            middle_time = middle_time.AddSeconds(finding_aos ? 1 : -1);
        }
    }

    /*
     * go back/forward 1second until below the horizon
     */
    running = true;
    cnt = 0;
    while (running && cnt++ < 6)
    {
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        if (topo.elevation > 0)
        {
            middle_time = middle_time.AddSeconds(finding_aos ? -1 : 1);
        }
        else
        {
            running = false;
        }
    }

    return middle_time;
}